

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_dec.c
# Opt level: O2

void VP8ParseQuant(VP8Decoder *dec)

{
  VP8BitReader *br;
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  int iVar8;
  int iVar9;
  int32_t iVar10;
  int32_t iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  VP8QuantMatrix *pVVar19;
  uint uVar20;
  
  br = &dec->br_;
  uVar6 = VP8GetValue(br,7);
  uVar7 = VP8GetValue(br,1);
  iVar9 = 0;
  iVar8 = 0;
  if (uVar7 != 0) {
    iVar8 = VP8GetSignedValue(br,4);
  }
  uVar7 = VP8GetValue(br,1);
  if (uVar7 != 0) {
    iVar9 = VP8GetSignedValue(br,4);
  }
  uVar7 = VP8GetValue(br,1);
  iVar11 = 0;
  iVar10 = 0;
  if (uVar7 != 0) {
    iVar10 = VP8GetSignedValue(br,4);
  }
  uVar7 = VP8GetValue(br,1);
  if (uVar7 != 0) {
    iVar11 = VP8GetSignedValue(br,4);
  }
  uVar7 = VP8GetValue(br,1);
  uVar20 = 0;
  iVar12 = 0;
  if (uVar7 != 0) {
    iVar12 = VP8GetSignedValue(br,4);
  }
  iVar1 = (dec->segment_hdr_).use_segment_;
  lVar17 = 0;
  pVVar19 = dec->dqm_;
  do {
    if (lVar17 == 4) {
      return;
    }
    if (iVar1 == 0) {
      uVar7 = uVar6;
      if (lVar17 == 0) goto LAB_0015442b;
      uVar2 = *(undefined8 *)dec->dqm_[0].y1_mat_;
      uVar3 = *(undefined8 *)dec->dqm_[0].y2_mat_;
      iVar4 = dec->dqm_[0].uv_quant_;
      iVar5 = dec->dqm_[0].dither_;
      *(undefined8 *)pVVar19->uv_mat_ = *(undefined8 *)dec->dqm_[0].uv_mat_;
      pVVar19->uv_quant_ = iVar4;
      pVVar19->dither_ = iVar5;
      *(undefined8 *)pVVar19->y1_mat_ = uVar2;
      *(undefined8 *)pVVar19->y2_mat_ = uVar3;
    }
    else {
      uVar7 = 0;
      if ((dec->segment_hdr_).absolute_delta_ == 0) {
        uVar7 = uVar6;
      }
      uVar7 = uVar7 + (int)(dec->segment_hdr_).quantizer_[lVar17];
LAB_0015442b:
      uVar14 = uVar7 + iVar8;
      if (0x7e < (int)(uVar7 + iVar8)) {
        uVar14 = 0x7f;
      }
      if ((int)uVar14 < 1) {
        uVar14 = 0;
      }
      uVar13 = 0x7f;
      uVar18 = uVar13;
      if ((int)uVar7 < 0x7f) {
        uVar18 = uVar7;
      }
      pVVar19->y1_mat_[0] = (uint)kDcTable[uVar14];
      uVar15 = (ulong)uVar18;
      if ((int)uVar18 < 1) {
        uVar15 = 0;
      }
      uVar14 = iVar9 + uVar7;
      if (0x7e < (int)(iVar9 + uVar7)) {
        uVar14 = uVar13;
      }
      if ((int)uVar14 < 1) {
        uVar14 = uVar20;
      }
      pVVar19->y1_mat_[1] = (uint)kAcTable[uVar15];
      uVar18 = uVar7 + iVar10;
      uVar16 = uVar13;
      if ((int)uVar18 < 0x7f) {
        uVar16 = uVar18;
      }
      if ((int)uVar16 < 1) {
        uVar16 = uVar20;
      }
      pVVar19->y2_mat_[0] = (uint)kDcTable[uVar14] * 2;
      uVar14 = (uint)kAcTable[uVar16] * 0x18ccd >> 0x10;
      if ((int)uVar18 < 2) {
        uVar14 = 8;
      }
      pVVar19->y2_mat_[1] = uVar14;
      uVar14 = uVar7 + iVar11;
      if (0x74 < (int)uVar14) {
        uVar14 = 0x75;
      }
      if ((int)uVar14 < 1) {
        uVar14 = uVar20;
      }
      uVar18 = uVar7 + iVar12;
      if ((int)uVar18 < 0x7f) {
        uVar13 = uVar18;
      }
      if ((int)uVar13 < 1) {
        uVar13 = uVar20;
      }
      pVVar19->uv_mat_[0] = (uint)kDcTable[uVar14];
      pVVar19->uv_mat_[1] = (uint)kAcTable[uVar13];
      pVVar19->uv_quant_ = uVar18;
    }
    lVar17 = lVar17 + 1;
    pVVar19 = pVVar19 + 1;
  } while( true );
}

Assistant:

void VP8ParseQuant(VP8Decoder* const dec) {
  VP8BitReader* const br = &dec->br_;
  const int base_q0 = VP8GetValue(br, 7, "global-header");
  const int dqy1_dc = VP8Get(br, "global-header") ?
       VP8GetSignedValue(br, 4, "global-header") : 0;
  const int dqy2_dc = VP8Get(br, "global-header") ?
       VP8GetSignedValue(br, 4, "global-header") : 0;
  const int dqy2_ac = VP8Get(br, "global-header") ?
       VP8GetSignedValue(br, 4, "global-header") : 0;
  const int dquv_dc = VP8Get(br, "global-header") ?
       VP8GetSignedValue(br, 4, "global-header") : 0;
  const int dquv_ac = VP8Get(br, "global-header") ?
       VP8GetSignedValue(br, 4, "global-header") : 0;

  const VP8SegmentHeader* const hdr = &dec->segment_hdr_;
  int i;

  for (i = 0; i < NUM_MB_SEGMENTS; ++i) {
    int q;
    if (hdr->use_segment_) {
      q = hdr->quantizer_[i];
      if (!hdr->absolute_delta_) {
        q += base_q0;
      }
    } else {
      if (i > 0) {
        dec->dqm_[i] = dec->dqm_[0];
        continue;
      } else {
        q = base_q0;
      }
    }
    {
      VP8QuantMatrix* const m = &dec->dqm_[i];
      m->y1_mat_[0] = kDcTable[clip(q + dqy1_dc, 127)];
      m->y1_mat_[1] = kAcTable[clip(q + 0,       127)];

      m->y2_mat_[0] = kDcTable[clip(q + dqy2_dc, 127)] * 2;
      // For all x in [0..284], x*155/100 is bitwise equal to (x*101581) >> 16.
      // The smallest precision for that is '(x*6349) >> 12' but 16 is a good
      // word size.
      m->y2_mat_[1] = (kAcTable[clip(q + dqy2_ac, 127)] * 101581) >> 16;
      if (m->y2_mat_[1] < 8) m->y2_mat_[1] = 8;

      m->uv_mat_[0] = kDcTable[clip(q + dquv_dc, 117)];
      m->uv_mat_[1] = kAcTable[clip(q + dquv_ac, 127)];

      m->uv_quant_ = q + dquv_ac;   // for dithering strength evaluation
    }
  }
}